

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::AddressTest_AddressNegativeTests_SetInvalidRawAddress_Test::TestBody
          (AddressTest_AddressNegativeTests_SetInvalidRawAddress_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  Message local_a8;
  ErrorCode local_a0 [5];
  allocator<unsigned_char> local_8c;
  uchar local_8b [3];
  iterator local_88;
  size_type local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  Error local_60;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Address addr;
  AddressTest_AddressNegativeTests_SetInvalidRawAddress_Test *this_local;
  
  Address::Address((Address *)&gtest_ar.message_);
  local_8b[0] = '\0';
  local_8b[1] = 0;
  local_8b[2] = 0;
  local_88 = local_8b;
  local_80 = 3;
  std::allocator<unsigned_char>::allocator(&local_8c);
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_78,__l,&local_8c);
  Address::Set(&local_60,(Address *)&gtest_ar.message_,&local_78);
  local_a0[0] = kInvalidArgs;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_38,"addr.Set(ByteArray{0, 0, 0})","ErrorCode::kInvalidArgs",&local_60
             ,local_a0);
  Error::~Error(&local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_78);
  std::allocator<unsigned_char>::~allocator(&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  bVar1 = Address::IsValid((Address *)&gtest_ar.message_);
  local_c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_c0,
               (AssertionResult *)"addr.IsValid()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  bVar1 = Address::IsIpv4((Address *)&gtest_ar.message_);
  local_109 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_108,
               (AssertionResult *)"addr.IsIpv4()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  bVar1 = Address::IsIpv6((Address *)&gtest_ar.message_);
  local_151 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)local_150,(AssertionResult *)"addr.IsIpv6()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/address_test.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  Address::~Address((Address *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(AddressTest, AddressNegativeTests_SetInvalidRawAddress)
{
    Address addr;

    EXPECT_EQ(addr.Set(ByteArray{0, 0, 0}), ErrorCode::kInvalidArgs);
    EXPECT_FALSE(addr.IsValid());
    EXPECT_FALSE(addr.IsIpv4());
    EXPECT_FALSE(addr.IsIpv6());
}